

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_spi_setClockDivider(uint16_t divider)

{
  uint32_t *paddr;
  uint16_t divider_local;
  
  bcm2835_peri_write(bcm2835_spi0 + 2,(uint)divider);
  return;
}

Assistant:

void bcm2835_spi_setClockDivider(uint16_t divider)
{
    volatile uint32_t* paddr = bcm2835_spi0 + BCM2835_SPI0_CLK/4;
    bcm2835_peri_write(paddr, divider);
}